

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O3

void __thiscall disp::hg(disp *this,cmatch *m)

{
  undefined8 *puVar1;
  int *piVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  difference_type __d_1;
  ulong uVar8;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  long *local_40;
  ulong local_38;
  long local_30;
  long lStack_28;
  
  piVar2 = *(int **)(m + 0x10);
  if (((int)((ulong)(*(long *)(m + 0x18) - (long)piVar2) >> 3) < 1) || ((long)*piVar2 == -1)) {
    local_60 = local_50;
    local_58 = 0;
    local_50[0] = 0;
  }
  else {
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,(long)*piVar2 + *(long *)m,(long)piVar2[1] + *(long *)m);
  }
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x132d61);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_30 = *plVar6;
    lStack_28 = plVar4[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar6;
    local_40 = (long *)*plVar4;
  }
  local_38 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_40,local_38,0,'\x01');
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_90 = *puVar7;
    uStack_88 = (undefined4)plVar4[3];
    uStack_84 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar7;
    local_a0 = (ulong *)*plVar4;
  }
  local_98 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  lVar3 = *(long *)(m + 0x10);
  if (((int)((ulong)(*(long *)(m + 0x18) - lVar3) >> 3) < 2) || ((long)*(int *)(lVar3 + 8) == -1)) {
    local_c0 = &local_b0;
    local_b8 = 0;
    local_b0 = 0;
  }
  else {
    local_c0 = &local_b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,(long)*(int *)(lVar3 + 8) + *(long *)m,
               (long)*(int *)(lVar3 + 0xc) + *(long *)m);
  }
  uVar8 = 0xf;
  if (local_a0 != &local_90) {
    uVar8 = local_90;
  }
  if (uVar8 < (ulong)(local_b8 + local_98)) {
    uVar8 = 0xf;
    if (local_c0 != &local_b0) {
      uVar8 = CONCAT71(uStack_af,local_b0);
    }
    if ((ulong)(local_b8 + local_98) <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_a0);
      goto LAB_0012409e;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0);
LAB_0012409e:
  local_80 = &local_70;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_70 = *puVar1;
    uStack_68 = puVar5[3];
  }
  else {
    local_70 = *puVar1;
    local_80 = (undefined8 *)*puVar5;
  }
  local_78 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_80);
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

void hg(booster::cmatch const &m)
	{ v_ = "m:" + std::string(m[0]) +':'+std::string(m[1]); }